

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTestUnexpectedIndent::Run(DyndepParserTestUnexpectedIndent *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [8];
  string err;
  DyndepParser parser;
  char kInput [6];
  DyndepParserTestUnexpectedIndent *this_local;
  
  parser.env_.parent_._4_2_ = 10;
  parser.env_.parent_._0_4_ = 0x31203d20;
  DyndepParser::DyndepParser
            ((DyndepParser *)((long)&err.field_2 + 8),&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  std::__cxx11::string::string((string *)local_f8);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,(char *)&parser.env_.parent_,&local_119);
  bVar2 = DyndepParser::ParseTest
                    ((DyndepParser *)((long)&err.field_2 + 8),&local_118,(string *)local_f8);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0xb6,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: unexpected indent\n",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0xb7,"\"input:1: unexpected indent\\n\" == err");
  std::__cxx11::string::~string((string *)local_f8);
  DyndepParser::~DyndepParser((DyndepParser *)((long)&err.field_2 + 8));
  return;
}

Assistant:

TEST_F(DyndepParserTest, UnexpectedIndent) {
  const char kInput[] =
" = 1\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: unexpected indent\n", err);
}